

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  uchar *puVar1;
  byte *pbVar2;
  uchar *puVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  ArrayPtr<const_unsigned_char> AVar7;
  
  if (bytes == 0) {
    return;
  }
LAB_00286c8b:
  AVar7 = kj::BufferedInputStream::getReadBuffer(this->inner);
  pbVar2 = AVar7.ptr;
LAB_00286c97:
  while( true ) {
    if (9 < (ulong)((long)(AVar7.ptr + AVar7.size_) - (long)pbVar2)) break;
    if (AVar7.ptr + AVar7.size_ != pbVar2) {
      bVar5 = *pbVar2;
      pbVar2 = pbVar2 + 1;
      uVar4 = 0;
      do {
        if ((bVar5 >> (uVar4 & 0x1f) & 1) != 0) {
          if (AVar7.ptr + AVar7.size_ == pbVar2) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar7.size_);
            AVar7 = kj::BufferedInputStream::getReadBuffer(this->inner);
            pbVar2 = AVar7.ptr;
            if (AVar7.size_ == 0) {
              skip();
              return;
            }
          }
          pbVar2 = pbVar2 + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 8);
      if ((AVar7.ptr + AVar7.size_ == pbVar2) && ((byte)(bVar5 + 1) < 2)) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar7.size_);
        AVar7 = kj::BufferedInputStream::getReadBuffer(this->inner);
        pbVar2 = AVar7.ptr;
        if (AVar7.size_ == 0) {
          skip();
          return;
        }
      }
      goto LAB_00286d9a;
    }
    (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar7.size_);
    AVar7 = kj::BufferedInputStream::getReadBuffer(this->inner);
    pbVar2 = AVar7.ptr;
    if (AVar7.size_ == 0) {
      skip();
      return;
    }
  }
  bVar5 = *pbVar2;
  pbVar2 = pbVar2 + (ulong)(bVar5 >> 7) +
                    (ulong)((bVar5 >> 6 & 1) != 0) +
                    (ulong)(bVar5 >> 5 & 1) +
                    (ulong)((bVar5 >> 4 & 1) != 0) +
                    (ulong)(bVar5 >> 3 & 1) +
                    (ulong)((bVar5 >> 2 & 1) != 0) +
                    (ulong)(bVar5 >> 1 & 1) + (ulong)(bVar5 & 1) + 1;
LAB_00286d9a:
  bytes = bytes + -8;
  if (bVar5 == 0xff) {
    puVar1 = (uchar *)((ulong)*pbVar2 * 8);
    bVar6 = bytes < puVar1;
    bytes = bytes + (ulong)*pbVar2 * -8;
    if (bVar6) {
      skip();
      return;
    }
    puVar3 = AVar7.ptr + (AVar7.size_ - (long)(pbVar2 + 1));
    if (puVar3 <= puVar1) goto LAB_00286de4;
    pbVar2 = pbVar2 + 1 + (long)puVar1;
  }
  else if (bVar5 == 0) {
    bVar6 = bytes < (uchar *)((ulong)*pbVar2 * 8);
    bytes = bytes + (ulong)*pbVar2 * -8;
    if (bVar6) {
      skip();
      return;
    }
    pbVar2 = pbVar2 + 1;
  }
  if ((uchar *)bytes == (uchar *)0x0) {
    (*(this->inner->super_InputStream)._vptr_InputStream[3])
              (this->inner,(long)pbVar2 - (long)AVar7.ptr);
    return;
  }
  goto LAB_00286c97;
LAB_00286de4:
  (*(this->inner->super_InputStream)._vptr_InputStream[3])
            (this->inner,(ulong)(uint)((int)puVar1 - (int)puVar3) + AVar7.size_);
  if ((uchar *)bytes == (uchar *)0x0) {
    return;
  }
  goto LAB_00286c8b;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}